

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O3

HPDF_UINT32 HPDF_GetStreamSize(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_UINT32 HVar2;
  HPDF_STATUS HVar3;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    HVar2 = 0x1025;
  }
  else {
    HVar3 = HPDF_Stream_Validate(pdf->stream);
    if (HVar3 != 0) {
      HVar2 = HPDF_Stream_Size(pdf->stream);
      return HVar2;
    }
    HVar2 = 0;
  }
  return HVar2;
}

Assistant:

HPDF_EXPORT(HPDF_UINT32)
HPDF_GetStreamSize  (HPDF_Doc   pdf)
{
    HPDF_PTRACE ((" HPDF_GetStreamSize\n"));

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    if (!HPDF_Stream_Validate (pdf->stream))
        return 0;

    return HPDF_Stream_Size(pdf->stream);
}